

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O2

void __thiscall
chrono::ChFile_ps::DrawText
          (ChFile_ps *this,ChVector2<double> *mfrom,char *string,Space space,Justification justified
          )

{
  ChStreamOutAscii *this_00;
  char *pcVar1;
  char *str;
  double local_48;
  double dStack_40;
  
  GrSave(this);
  local_48 = mfrom->m_data[0];
  dStack_40 = mfrom->m_data[1];
  TransPt((ChFile_ps *)&stack0xffffffffffffffc8,(ChVector2<double> *)this,(Space)&local_48);
  MoveTo(this,(ChVector2<double> *)&stack0xffffffffffffffc8);
  this_00 = &(this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii;
  ChStreamOutAscii::operator<<(this_00,"(");
  ChStreamOutAscii::operator<<(this_00,string);
  pcVar1 = ") show \n";
  if (justified == RIGHT) {
    pcVar1 = ") dup stringwidth pop neg 0 rmoveto show \n";
  }
  str = ") dup stringwidth pop 2 div neg 0 rmoveto show \n";
  if (justified != CENTER) {
    str = pcVar1;
  }
  ChStreamOutAscii::operator<<(this_00,str);
  GrRestore(this);
  return;
}

Assistant:

void ChFile_ps::DrawText(ChVector2<> mfrom, char* string, Space space, Justification justified) {
    GrSave();
    MoveTo(TransPt(mfrom, space));
    *this << "(";
    *this << string;
    switch (justified) {
        case Justification::LEFT:
            *this << ") show \n";
            break;
        case Justification::RIGHT:
            *this << ") dup stringwidth pop neg 0 rmoveto show \n";
            break;
        case Justification::CENTER:
            *this << ") dup stringwidth pop 2 div neg 0 rmoveto show \n";
            break;
        default:
            *this << ") show \n";
    }
    GrRestore();
}